

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.c
# Opt level: O1

void AllocateInChuck(Heap *heap,Chuck *chuck,Size size)

{
  Chuck *chuck_00;
  Size SVar1;
  ulong uVar2;
  Chuck *chuck_01;
  ulong uVar3;
  
  MoveOut(heap,chuck);
  uVar3 = (ulong)(*(uint *)&chuck->field_0x4 >> 1);
  if (((&chuck->field_0x4)[uVar3 * 8] & 1) != 0) {
    __assert_fail("!GetUsed(chuck)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/HeapImpl.h"
                  ,0x89,"Chuck *SplitIfWorthy(Chuck *, Size)");
  }
  uVar3 = uVar3 * 8;
  if (size <= uVar3) {
    SVar1 = 0x18;
    if (0x18 < size) {
      SVar1 = size;
    }
    uVar2 = SVar1 + 7 & 0xfffffffffffffff8;
    if (uVar3 < uVar2 + 0x18) {
      chuck_01 = (Chuck *)0x0;
    }
    else {
      SetSize(chuck,uVar2);
      uVar2 = (ulong)(*(uint *)&chuck->field_0x4 >> 1);
      chuck_01 = (Chuck *)(&chuck->lowerSize + uVar2 * 2);
      *(uint *)&chuck_01->field_0x4 = *(uint *)&chuck_01->field_0x4 & 0xfffffffe;
      SetSize(chuck,uVar2 * 8);
      SetSize(chuck_01,uVar3 + uVar2 * -8);
    }
    if (chuck_01 != (Chuck *)0x0) {
      chuck_00 = (Chuck *)(&chuck_01->lowerSize + (ulong)(*(uint *)&chuck_01->field_0x4 >> 1) * 2);
      if (((&chuck_00->field_0x4)[(ulong)(*(uint *)&chuck_00->field_0x4 >> 1) * 8] & 1) == 0) {
        MoveOut(heap,chuck_00);
        uVar3 = (ulong)(*(uint *)&chuck_01->field_0x4 >> 1);
        SetSize(chuck_01,uVar3 * 8 + (ulong)(*(uint *)(&chuck_01->field_0x4 + uVar3 * 8) >> 1) * 8);
      }
      MoveIn(heap,chuck_01);
      return;
    }
    return;
  }
  __assert_fail("size <= GetSize(chuck)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/HeapImpl.h"
                ,0x8a,"Chuck *SplitIfWorthy(Chuck *, Size)");
}

Assistant:

static void AllocateInChuck(Heap *heap, Chuck *chuck, Size size) {
    MoveOut(heap, chuck);
    Chuck *remain = SplitIfWorthy(chuck, size);
    if (remain) {
        if (!GetUsed(GetHigher(remain))) {
            MoveOut(heap, GetHigher(remain));
            SetHigher(remain, GetHigher(GetHigher(remain)));
        }
        MoveIn(heap, remain);
    }
}